

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,Point2f u)

{
  float *pfVar1;
  float *pfVar2;
  ulong *puVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar32 [48];
  undefined1 auVar28 [64];
  undefined1 auVar30 [64];
  float fVar33;
  undefined1 in_register_00001208 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  Float pdf;
  Float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Tuple2<pbrt::Point2,_float> local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Tuple3<pbrt::Point3,_float> local_88;
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_68;
  Point3fi local_58;
  undefined1 auVar29 [64];
  undefined1 auVar31 [64];
  undefined1 extraout_var [56];
  
  auVar32 = in_ZmmResult._16_48_;
  auVar34._8_56_ = in_register_00001208;
  auVar34._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_e8 = auVar34._0_16_;
  local_b0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_e8);
  pcVar10 = *(char **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar11 = *(long *)(pcVar10 + 0x10);
  lVar16 = (long)this->blpIndex * 0x10;
  lVar12 = *(long *)(pcVar10 + 0x18);
  pfVar1 = (float *)(lVar12 + (long)*(int *)(lVar11 + lVar16) * 0xc);
  pfVar2 = (float *)(lVar12 + (long)*(int *)(lVar11 + 4 + lVar16) * 0xc);
  local_f8 = 1.0;
  puVar3 = (ulong *)(lVar12 + (long)*(int *)(lVar11 + 8 + lVar16) * 0xc);
  pfVar4 = (float *)(lVar12 + (long)*(int *)(lVar11 + 0xc + lVar16) * 0xc);
  if (*(PiecewiseConstant2D **)(pcVar10 + 0x38) == (PiecewiseConstant2D *)0x0) {
    bVar17 = IsRectangle(this);
    if (!bVar17) {
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)pfVar2;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)pfVar4;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)pfVar1;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *puVar3;
      local_d8._8_8_ = 0;
      local_d8._0_4_ = local_b0.x;
      local_d8._4_4_ = local_b0.y;
      auVar20 = vinsertps_avx(ZEXT416((uint)puVar3[1]),ZEXT416((uint)pfVar2[2]),0x10);
      fVar56 = pfVar1[2];
      auVar19._4_4_ = fVar56;
      auVar19._0_4_ = fVar56;
      auVar19._8_4_ = fVar56;
      auVar19._12_4_ = fVar56;
      auVar26 = vsubps_avx512vl(auVar20,auVar19);
      auVar19 = vinsertps_avx(auVar49,auVar25,0x50);
      auVar18 = vinsertps_avx(auVar44,auVar23,0x50);
      auVar22 = vsubps_avx(auVar44,auVar23);
      auVar41 = vsubps_avx(auVar49,auVar25);
      auVar40 = vmovshdup_avx(local_d8);
      auVar43 = vsubps_avx(auVar19,auVar18);
      auVar21 = vinsertps_avx(auVar43,auVar22,0x1c);
      auVar37 = vinsertps_avx(auVar43,auVar22,0x4c);
      auVar19 = vpermt2ps_avx512vl(auVar25,_DAT_004ffae0,auVar49);
      auVar18 = vpermt2ps_avx512vl(auVar23,_DAT_004ffae0,auVar44);
      auVar23 = vsubps_avx(auVar19,auVar18);
      fVar56 = pfVar4[2];
      auVar24._4_4_ = fVar56;
      auVar24._0_4_ = fVar56;
      auVar24._8_4_ = fVar56;
      auVar24._12_4_ = fVar56;
      auVar19 = vblendps_avx(auVar23,auVar26,2);
      auVar18 = vblendps_avx(auVar23,auVar22,2);
      auVar24 = vsubps_avx(auVar24,auVar20);
      auVar20 = vblendps_avx(auVar26,auVar22,2);
      auVar50._0_4_ = auVar20._0_4_ * auVar19._0_4_;
      auVar50._4_4_ = auVar20._4_4_ * auVar19._4_4_;
      auVar50._8_4_ = auVar20._8_4_ * auVar19._8_4_;
      auVar50._12_4_ = auVar20._12_4_ * auVar19._12_4_;
      auVar25 = vshufps_avx(auVar20,auVar20,0xe1);
      auVar20 = vblendps_avx(auVar24,auVar43,2);
      auVar25 = vfmsub213ps_fma(auVar25,auVar20,auVar50);
      auVar18 = vfnmadd213ps_fma(auVar18,auVar26,auVar50);
      auVar51._0_4_ = auVar25._0_4_ + auVar18._0_4_;
      auVar51._4_4_ = auVar25._4_4_ + auVar18._4_4_;
      auVar51._8_4_ = auVar25._8_4_ + auVar18._8_4_;
      auVar51._12_4_ = auVar25._12_4_ + auVar18._12_4_;
      auVar18 = vblendps_avx(auVar22,auVar23,2);
      auVar25 = vinsertps_avx(auVar24,auVar26,0x10);
      auVar59._0_4_ = auVar18._0_4_ * auVar25._0_4_;
      auVar59._4_4_ = auVar18._4_4_ * auVar25._4_4_;
      auVar59._8_4_ = auVar18._8_4_ * auVar25._8_4_;
      auVar59._12_4_ = auVar18._12_4_ * auVar25._12_4_;
      auVar25 = vfnmadd213ps_fma(auVar25,auVar18,auVar59);
      auVar18 = vshufps_avx(auVar22,auVar22,0xe1);
      auVar53._0_4_ = auVar18._0_4_ * auVar43._0_4_;
      auVar53._4_4_ = auVar18._4_4_ * auVar43._4_4_;
      auVar53._8_4_ = auVar18._8_4_ * auVar43._8_4_;
      auVar53._12_4_ = auVar18._12_4_ * auVar43._12_4_;
      auVar37 = vfnmadd213ps_fma(auVar37,auVar21,auVar53);
      auVar18 = vfmsub213ps_fma(auVar21,auVar26,auVar59);
      auVar21 = vfmsub213ps_fma(auVar23,auVar22,auVar53);
      fVar56 = auVar18._0_4_ + auVar25._0_4_;
      fVar57 = auVar18._4_4_ + auVar25._4_4_;
      fVar58 = auVar18._8_4_ + auVar25._8_4_;
      fVar52 = auVar18._12_4_ + auVar25._12_4_;
      auVar27._0_4_ = auVar21._0_4_ + auVar37._0_4_;
      auVar27._4_4_ = auVar21._4_4_ + auVar37._4_4_;
      auVar27._8_4_ = auVar21._8_4_ + auVar37._8_4_;
      auVar27._12_4_ = auVar21._12_4_ + auVar37._12_4_;
      auVar54._0_4_ = fVar56 * fVar56;
      auVar54._4_4_ = fVar57 * fVar57;
      auVar54._8_4_ = fVar58 * fVar58;
      auVar54._12_4_ = fVar52 * fVar52;
      auVar21 = vfmadd231ps_fma(auVar54,auVar51,auVar51);
      auVar18 = vblendps_avx(auVar23,auVar41,2);
      auVar37 = vfmadd231ps_fma(auVar21,auVar27,auVar27);
      auVar21 = vinsertps_avx(auVar41,auVar24,0x4c);
      auVar42._0_4_ = auVar21._0_4_ * auVar19._0_4_;
      auVar42._4_4_ = auVar21._4_4_ * auVar19._4_4_;
      auVar42._8_4_ = auVar21._8_4_ * auVar19._8_4_;
      auVar42._12_4_ = auVar21._12_4_ * auVar19._12_4_;
      auVar19 = vinsertps_avx(auVar24,auVar41,0x4c);
      auVar21 = vfmsub213ps_fma(auVar19,auVar20,auVar42);
      auVar19 = vinsertps_avx(auVar26,auVar24,0x40);
      auVar20 = vinsertps_avx(auVar26,auVar24,0x4c);
      local_e8 = vsqrtps_avx(auVar37);
      auVar19 = vfnmadd213ps_fma(auVar18,auVar19,auVar42);
      auVar26._0_4_ = auVar19._0_4_ + auVar21._0_4_;
      auVar26._4_4_ = auVar19._4_4_ + auVar21._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + auVar21._8_4_;
      auVar26._12_4_ = auVar19._12_4_ + auVar21._12_4_;
      auVar19 = vblendps_avx(auVar41,auVar23,2);
      auVar18 = vinsertps_avx(auVar43,auVar41,0x1c);
      auVar47._0_4_ = auVar19._0_4_ * auVar24._0_4_;
      auVar47._4_4_ = auVar19._4_4_ * auVar24._4_4_;
      auVar47._8_4_ = auVar19._8_4_ * auVar24._8_4_;
      auVar47._12_4_ = auVar19._12_4_ * auVar24._12_4_;
      auVar21 = vfnmadd213ps_fma(auVar24,auVar19,auVar47);
      auVar19 = vfmsub213ps_fma(auVar20,auVar18,auVar47);
      fVar56 = auVar19._0_4_ + auVar21._0_4_;
      fVar57 = auVar19._4_4_ + auVar21._4_4_;
      fVar58 = auVar19._8_4_ + auVar21._8_4_;
      fVar52 = auVar19._12_4_ + auVar21._12_4_;
      auVar19 = vshufps_avx(auVar41,auVar41,0xe1);
      auVar22._0_4_ = auVar19._0_4_ * auVar43._0_4_;
      auVar22._4_4_ = auVar19._4_4_ * auVar43._4_4_;
      auVar22._8_4_ = auVar19._8_4_ * auVar43._8_4_;
      auVar22._12_4_ = auVar19._12_4_ * auVar43._12_4_;
      auVar20 = vfmsub213ps_fma(auVar23,auVar41,auVar22);
      auVar19 = vinsertps_avx(auVar43,auVar41,0x4c);
      auVar37._0_4_ = fVar56 * fVar56;
      auVar37._4_4_ = fVar57 * fVar57;
      auVar37._8_4_ = fVar58 * fVar58;
      auVar37._12_4_ = fVar52 * fVar52;
      auVar18 = vfnmadd213ps_fma(auVar19,auVar18,auVar22);
      auVar19 = vfmadd231ps_fma(auVar37,auVar26,auVar26);
      auVar21._0_4_ = auVar20._0_4_ + auVar18._0_4_;
      auVar21._4_4_ = auVar20._4_4_ + auVar18._4_4_;
      auVar21._8_4_ = auVar20._8_4_ + auVar18._8_4_;
      auVar21._12_4_ = auVar20._12_4_ + auVar18._12_4_;
      fVar57 = auVar40._0_4_;
      auVar19 = vfmadd231ps_fma(auVar19,auVar21,auVar21);
      local_a8 = vsqrtps_avx(auVar19);
      auVar18._0_4_ = local_e8._0_4_ + local_a8._0_4_;
      auVar18._4_4_ = local_e8._4_4_ + local_a8._4_4_;
      auVar18._8_4_ = local_e8._8_4_ + local_a8._8_4_;
      auVar18._12_4_ = local_e8._12_4_ + local_a8._12_4_;
      local_c8 = vmovshdup_avx(auVar18);
      fVar58 = local_c8._0_4_;
      fVar56 = fVar57 * (fVar58 + auVar18._0_4_);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * auVar18._0_4_ * auVar18._0_4_)),
                                ZEXT416((uint)(fVar58 * fVar58)),ZEXT416((uint)(1.0 - fVar57)));
      if (auVar19._0_4_ < 0.0) {
        local_98._0_4_ = fVar56;
        fVar57 = sqrtf(auVar19._0_4_);
        fVar56 = (float)local_98._0_4_;
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar57 = auVar19._0_4_;
      }
      auVar19 = vmovshdup_avx(local_e8);
      auVar18 = vmovshdup_avx(local_a8);
      fVar64 = local_d8._0_4_;
      local_d8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                            ZEXT416((uint)(fVar56 / (local_c8._0_4_ + fVar57))));
      fVar56 = local_d8._0_4_;
      fVar57 = 1.0 - fVar56;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_e8._0_4_ * fVar56)),ZEXT416((uint)fVar57),
                                auVar19);
      fVar58 = auVar20._0_4_;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_a8._0_4_ * fVar56)),ZEXT416((uint)fVar57),
                                auVar18);
      fVar52 = auVar20._0_4_;
      fVar56 = fVar64 * (fVar58 + fVar52);
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar52 * fVar52)),
                                ZEXT416((uint)(fVar58 * fVar58)),ZEXT416((uint)(1.0 - fVar64)));
      if (auVar20._0_4_ < 0.0) {
        local_f4 = fVar56;
        local_f0 = fVar58;
        local_ec = fVar57;
        local_98 = auVar19;
        local_78 = auVar18;
        fVar52 = sqrtf(auVar20._0_4_);
        fVar57 = local_ec;
        fVar56 = local_f4;
        auVar19 = local_98;
        auVar18 = local_78;
        fVar58 = local_f0;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar52 = auVar20._0_4_;
      }
      local_f8 = 0.0;
      auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar56 / (fVar58 + fVar52))));
      fVar56 = auVar20._0_4_;
      if ((((0.0 <= fVar56) && (fVar56 <= 1.0)) && (fVar58 = local_d8._0_4_, 0.0 <= fVar58)) &&
         (fVar58 <= 1.0)) {
        fVar52 = local_e8._0_4_ + local_c8._0_4_ + local_a8._0_4_;
        if ((fVar52 != 0.0) || (local_f8 = 1.0, NAN(fVar52))) {
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar57 * fVar56)),auVar19,
                                    ZEXT416((uint)(fVar57 * (1.0 - fVar56))));
          auVar19 = vfmadd213ss_fma(local_e8,ZEXT416((uint)(fVar58 * (1.0 - fVar56))),auVar19);
          auVar19 = vfmadd213ss_fma(local_a8,ZEXT416((uint)(fVar58 * fVar56)),auVar19);
          local_f8 = (auVar19._0_4_ * 4.0) / fVar52;
        }
      }
      local_e8 = vinsertps_avx(auVar20,local_d8,0x10);
    }
  }
  else {
    auVar35._0_8_ =
         PiecewiseConstant2D::Sample
                   (*(PiecewiseConstant2D **)(pcVar10 + 0x38),(Point2f *)&local_b0,&local_f8);
    auVar35._8_56_ = extraout_var;
    local_e8 = auVar35._0_16_;
  }
  fVar56 = *pfVar1;
  uVar5 = (uint)*puVar3;
  auVar19 = vmovshdup_avx(local_e8);
  fVar46 = auVar19._0_4_;
  fVar13 = 1.0 - fVar46;
  auVar18 = vmulss_avx512f(auVar19,ZEXT416(uVar5));
  fVar33 = local_e8._0_4_;
  fVar14 = 1.0 - fVar33;
  fVar52 = fVar56 * fVar13 + auVar18._0_4_;
  fVar57 = *pfVar2;
  fVar58 = *pfVar4;
  fVar64 = fVar46 * fVar58 + fVar13 * fVar57;
  fVar15 = fVar64 - fVar52;
  uVar6 = *(ulong *)((long)puVar3 + 4);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar6;
  uVar7 = *(ulong *)(pfVar1 + 1);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar7;
  auVar60._0_4_ = fVar46 * (float)uVar6 + fVar13 * (float)uVar7;
  auVar60._4_4_ = auVar19._4_4_ * (float)(uVar6 >> 0x20) + fVar13 * (float)(uVar7 >> 0x20);
  auVar60._8_4_ = auVar19._8_4_ * 0.0 + fVar13 * 0.0;
  auVar60._12_4_ = auVar19._12_4_ * 0.0 + fVar13 * 0.0;
  uVar7 = *(ulong *)(pfVar2 + 1);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar7;
  auVar18 = vmovshdup_avx(auVar60);
  uVar8 = *(ulong *)(pfVar4 + 1);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar8;
  auVar48._0_4_ = fVar13 * (float)uVar7 + fVar46 * (float)uVar8;
  auVar48._4_4_ = fVar13 * (float)(uVar7 >> 0x20) + auVar19._4_4_ * (float)(uVar8 >> 0x20);
  auVar48._8_4_ = fVar13 * 0.0 + auVar19._8_4_ * 0.0;
  auVar48._12_4_ = fVar13 * 0.0 + auVar19._12_4_ * 0.0;
  auVar19 = vmovshdup_avx512vl(auVar48);
  auVar19 = vmulss_avx512f(local_e8,auVar19);
  auVar20 = vaddss_avx512f(ZEXT416((uint)(fVar14 * auVar18._0_4_)),auVar19);
  auVar19 = vinsertps_avx(ZEXT416((uint)(fVar33 * fVar64 + fVar14 * fVar52)),
                          ZEXT416((uint)(fVar14 * auVar60._0_4_ + auVar48._0_4_ * fVar33)),0x10);
  auVar18 = vsubps_avx(auVar48,auVar60);
  local_88._0_8_ = vmovlps_avx(auVar19);
  local_88.z = auVar20._0_4_;
  auVar19 = vmovshdup_avx(auVar18);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_)),ZEXT416((uint)fVar15),
                            ZEXT416((uint)fVar15));
  auVar19 = vfmadd231ss_fma(auVar20,auVar19,auVar19);
  fVar52 = auVar19._0_4_;
  if ((fVar52 != 0.0) || (NAN(fVar52))) {
    auVar21 = vmulss_avx512f(local_e8,auVar45);
    auVar19 = vshufps_avx(auVar41,auVar41,0xe1);
    auVar61._4_4_ = fVar14;
    auVar61._0_4_ = fVar14;
    auVar61._8_4_ = fVar14;
    auVar61._12_4_ = fVar14;
    auVar22 = vbroadcastss_avx512vl(local_e8);
    auVar20 = vinsertps_avx512f(auVar19,ZEXT416(uVar5),0x10);
    auVar65._0_4_ = fVar14 * auVar20._0_4_;
    auVar65._4_4_ = fVar14 * auVar20._4_4_;
    auVar65._8_4_ = fVar14 * auVar20._8_4_;
    auVar65._12_4_ = fVar14 * auVar20._12_4_;
    auVar23 = vaddss_avx512f(ZEXT416((uint)(fVar14 * (float)uVar6)),auVar21);
    auVar20 = vshufps_avx(auVar45,auVar45,0xe1);
    auVar21 = vinsertps_avx512f(auVar20,ZEXT416((uint)fVar58),0x10);
    auVar21 = vmulps_avx512vl(auVar22,auVar21);
    auVar24 = vaddps_avx512vl(auVar65,auVar21);
    auVar25 = vmulss_avx512f(ZEXT416((uint)fVar14),auVar40);
    auVar21 = vshufps_avx(auVar40,auVar40,0xe1);
    auVar37 = vinsertps_avx512f(auVar21,ZEXT416((uint)fVar56),0x10);
    auVar26 = vmulps_avx512vl(auVar61,auVar37);
    auVar27 = vaddss_avx512f(auVar25,ZEXT416((uint)(fVar33 * (float)uVar7)));
    auVar37 = vshufps_avx(auVar43,auVar43,0xe1);
    auVar25 = vinsertps_avx512f(auVar37,ZEXT416((uint)fVar57),0x10);
    auVar25 = vmulps_avx512vl(auVar22,auVar25);
    auVar22 = vsubss_avx512f(auVar23,auVar27);
    auVar25 = vaddps_avx512vl(auVar26,auVar25);
    auVar23 = vmulss_avx512f(auVar22,auVar22);
    auVar25 = vsubps_avx512vl(auVar24,auVar25);
    auVar24 = vmovshdup_avx512vl(auVar25);
    auVar23 = vfmadd231ss_avx512f(auVar23,auVar24,auVar24);
    vfmadd231ss_avx512f(auVar23,auVar25,auVar25);
    vucomiss_avx512f(ZEXT816(0) << 0x20);
    if ((fVar52 != 0.0) || (NAN(fVar52))) {
      auVar23 = vmulss_avx512f(auVar18,auVar24);
      auVar24 = vfnmadd213ss_avx512f(auVar24,auVar18,auVar23);
      auVar26 = vpermi2ps_avx512vl(ZEXT416(4),auVar25,auVar22);
      auVar27 = vpermi2ps_avx512vl(_DAT_004ffad0,auVar18,ZEXT416((uint)fVar15));
      auVar22 = vfmsub213ss_avx512f(auVar22,ZEXT416((uint)fVar15),auVar23);
      auVar23 = vmulps_avx512vl(auVar27,auVar26);
      auVar22 = vaddss_avx512f(auVar22,auVar24);
      auVar18 = vfmsub213ps_avx512vl(auVar25,auVar18,auVar23);
      auVar25 = vfnmadd213ps_avx512vl(auVar26,auVar27,auVar23);
      auVar25 = vaddps_avx512vl(auVar18,auVar25);
      auVar62._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar62._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar62._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar62._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar18 = vmovshdup_avx(auVar62);
      auVar18 = vfmadd231ss_fma(auVar18,auVar25,auVar25);
      auVar18 = vfmadd231ss_fma(auVar18,auVar22,auVar22);
      local_a8 = vsqrtss_avx(auVar18,auVar18);
      fVar64 = local_a8._0_4_;
      fVar52 = auVar22._0_4_ / fVar64;
      auVar63._4_4_ = fVar64;
      auVar63._0_4_ = fVar64;
      auVar63._8_4_ = fVar64;
      auVar63._12_4_ = fVar64;
      auVar18 = vdivps_avx(auVar25,auVar63);
      auVar29._8_4_ = auVar22._8_4_ ^ 0x80000000;
      auVar29._0_8_ = CONCAT44(auVar22._4_4_,fVar52) ^ 0x8000000080000000;
      auVar29._12_4_ = auVar22._12_4_ ^ 0x80000000;
      bVar17 = *pcVar10 == pcVar10[1];
      local_c8 = auVar18;
      if (!bVar17) {
        local_c8._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
        local_c8._8_4_ = auVar18._8_4_ ^ 0x80000000;
        local_c8._12_4_ = auVar18._12_4_ ^ 0x80000000;
      }
      auVar18 = vinsertps_avx(auVar41,auVar40,0x4c);
      auVar25 = vinsertps_avx(auVar45,auVar43,0x4c);
      auVar36._4_12_ = auVar21._4_12_;
      auVar36._0_4_ = fVar56;
      auVar39._4_12_ = auVar37._4_12_;
      auVar39._0_4_ = fVar57;
      auVar38._4_12_ = auVar20._4_12_;
      auVar38._0_4_ = fVar58;
      auVar29._16_48_ = auVar32;
      auVar28._4_60_ = auVar29._4_60_;
      auVar28._0_4_ = (uint)bVar17 * (int)fVar52 + (uint)!bVar17 * (int)-fVar52;
      local_d8 = auVar28._0_16_;
      auVar55._8_4_ = 0x7fffffff;
      auVar55._0_8_ = 0x7fffffff7fffffff;
      auVar55._12_4_ = 0x7fffffff;
      auVar31._16_48_ = auVar32;
      auVar31._0_16_ = auVar19;
      auVar30._4_60_ = auVar31._4_60_;
      auVar30._0_4_ = uVar5;
      auVar19 = vandps_avx(auVar55,auVar18);
      auVar18 = vandps_avx(auVar55,auVar25);
      auVar20 = vandps_avx(auVar55,auVar36);
      auVar21 = vandps_avx(auVar55,auVar39);
      auVar37 = vandps_avx(auVar55,auVar30._0_16_);
      auVar25 = vandps_avx(auVar55,auVar38);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar21,auVar20);
      auVar20 = vmaxps_avx(auVar25,auVar37);
      auVar21 = vmovshdup_avx(auVar19);
      auVar18 = vmaxps_avx(auVar20,auVar18);
      auVar20._8_4_ = 0x34800002;
      auVar20._0_8_ = 0x3480000234800002;
      auVar20._12_4_ = 0x34800002;
      auVar18 = vmulps_avx512vl(auVar18,auVar20);
      auVar19 = vmaxss_avx(auVar21,auVar19);
      local_68.z = auVar19._0_4_ * 2.3841864e-07;
      local_68._0_8_ = vmovlps_avx(auVar18);
      Point3fi::Point3fi(&local_58,(Point3f *)&local_88,(Vector3f *)&local_68);
      __return_storage_ptr__->set = true;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)
           local_58.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
      *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) =
           local_58.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
      *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
           local_58.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      uVar9 = vmovlps_avx(local_c8);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar9;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_d8._0_4_;
      uVar9 = vmovlps_avx(local_e8);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = uVar9;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
           local_f8 / (float)local_a8._0_4_;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Sample bilinear patch parametric $(u,v)$ coordinates
    Float pdf = 1;
    Point2f uv;
    if (mesh->imageDistribution)
        uv = mesh->imageDistribution->Sample(u, &pdf);
    else if (!IsRectangle()) {
        // Sample patch $(u,v)$ with approximate uniform area sampling
        // Initialize _w_ array with differential area at bilinear patch corners
        pstd::array<Float, 4> w = {
            Length(Cross(p10 - p00, p01 - p00)), Length(Cross(p10 - p00, p11 - p10)),
            Length(Cross(p01 - p00, p11 - p01)), Length(Cross(p11 - p10, p11 - p01))};

        uv = SampleBilinear(u, w);
        pdf = BilinearPDF(uv, w);

    } else
        uv = u;

    // Compute position, $\dpdu$, and $\dpdv$ for sampled bilinear patch $(u,v)$
    Point3f pu0 = Lerp(uv[1], p00, p01), pu1 = Lerp(uv[1], p10, p11);
    Point3f p = Lerp(uv[0], pu0, pu1);
    Vector3f dpdu = pu1 - pu0;
    Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);
    if (LengthSquared(dpdu) == 0 || LengthSquared(dpdv) == 0)
        return {};

    // Compute surface normal for sampled bilinear patch $(u,v)$
    Normal3f n = Normal3f(Normalize(Cross(dpdu, dpdv)));
    if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
        n = -n;

    // Compute _pError_ for sampled bilinear patch $(u,v)$
    Vector3f pError =
        gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

    // Return _ShapeSample_ for sampled bilinear patch point
    return ShapeSample{Interaction(Point3fi(p, pError), n, uv),
                       pdf / Length(Cross(dpdu, dpdv))};
}